

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

void __thiscall
clip_model_loader::get_f32(clip_model_loader *this,string *key,float *output,bool required)

{
  int iVar1;
  pointer pgVar2;
  undefined8 uVar3;
  runtime_error *this_00;
  undefined1 in_CL;
  char *in_RDX;
  unique_ptr<gguf_context,_gguf_context_deleter> *in_RDI;
  undefined4 uVar4;
  int i;
  string local_40 [32];
  undefined3 in_stack_ffffffffffffffe4;
  uint uVar5;
  
  uVar5 = CONCAT13(in_CL,in_stack_ffffffffffffffe4) & 0x1ffffff;
  pgVar2 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get(in_RDI);
  uVar3 = std::__cxx11::string::c_str();
  iVar1 = gguf_find_key(pgVar2,uVar3);
  if (iVar1 < 0) {
    if ((uVar5 & 0x1000000) != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(in_RDX,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(uVar5,iVar1));
      std::runtime_error::runtime_error(this_00,local_40);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    pgVar2 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get(in_RDI);
    uVar4 = gguf_get_val_f32(pgVar2,(long)iVar1);
    *(undefined4 *)in_RDX = uVar4;
  }
  return;
}

Assistant:

void get_f32(const std::string & key, float & output, bool required = true) {
        const int i = gguf_find_key(ctx_gguf.get(), key.c_str());
        if (i < 0) {
            if (required) throw std::runtime_error("Key not found: " + key);
            return;
        }
        output = gguf_get_val_f32(ctx_gguf.get(), i);
    }